

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav__on_seek_memory(void *pUserData,int offset,drwav_seek_origin origin)

{
  drwav__memory_stream *memory;
  drwav_seek_origin origin_local;
  int offset_local;
  void *pUserData_local;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("memory != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/dr_wav.h"
                  ,0x45c,"drwav_bool32 drwav__on_seek_memory(void *, int, drwav_seek_origin)");
  }
  if (origin == drwav_seek_origin_current) {
    memory._4_4_ = offset;
    if (offset < 1) {
      if (*(ulong *)((long)pUserData + 0x10) < (ulong)(long)-offset) {
        memory._4_4_ = -(int)*(undefined8 *)((long)pUserData + 0x10);
      }
    }
    else if (*(ulong *)((long)pUserData + 8) <
             (ulong)(*(long *)((long)pUserData + 0x10) + (long)offset)) {
      memory._4_4_ = (int)*(undefined8 *)((long)pUserData + 8) -
                     (int)*(undefined8 *)((long)pUserData + 0x10);
    }
    *(long *)((long)pUserData + 0x10) = (long)memory._4_4_ + *(long *)((long)pUserData + 0x10);
  }
  else if (*(ulong *)((long)pUserData + 8) < (ulong)(uint)offset) {
    *(undefined8 *)((long)pUserData + 0x10) = *(undefined8 *)((long)pUserData + 8);
  }
  else {
    *(long *)((long)pUserData + 0x10) = (long)offset;
  }
  return 1;
}

Assistant:

static drwav_bool32 drwav__on_seek_memory(void* pUserData, int offset, drwav_seek_origin origin) {
    drwav__memory_stream* memory = (drwav__memory_stream*)pUserData;
    drwav_assert(memory != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (memory->currentReadPos + offset > memory->dataSize) {
                offset = (int)(memory->dataSize - memory->currentReadPos);  // Trying to seek too far forward.
            }
        } else {
            if (memory->currentReadPos < (size_t)-offset) {
                offset = -(int)memory->currentReadPos;  // Trying to seek too far backwards.
            }
        }

        // This will never underflow thanks to the clamps above.
        memory->currentReadPos += offset;
    } else {
        if ((drwav_uint32)offset <= memory->dataSize) {
            memory->currentReadPos = offset;
        } else {
            memory->currentReadPos = memory->dataSize;  // Trying to seek too far forward.
        }
    }

    return DRWAV_TRUE;
}